

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardsurface.h
# Opt level: O2

void __thiscall rengine::StandardSurface::onEvent(StandardSurface *this,Event *e)

{
  Renderer *pRVar1;
  PointerEvent *e_00;
  ostream *poVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  mat4 local_b4;
  undefined1 local_70 [8];
  mat4 invNodeMatrix;
  bool inv;
  
  if (2 < e->m_type - PointerDown) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "virtual void rengine::StandardSurface::onEvent(Event *)");
    poVar2 = std::operator<<(poVar2,": unknown event type=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,e->m_type);
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  pRVar1 = (this->m_renderer)._M_t.
           super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>._M_t.
           super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
           super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl;
  if ((pRVar1 != (Renderer *)0x0) && (pRVar1->m_sceneRoot != (Node *)0x0)) {
    e_00 = PointerEvent::from(e);
    if (this->m_pointerEventReceiver == (Node *)0x0) {
      deliverPointerEventInScene
                (this,((this->m_renderer)._M_t.
                       super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>
                       .super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl)->m_sceneRoot
                 ,e_00);
      return;
    }
    invNodeMatrix.m[0xf]._3_1_ = '\0';
    TransformNode::matrixFor
              (&local_b4,this->m_pointerEventReceiver,
               ((this->m_renderer)._M_t.
                super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>.
                _M_t.
                super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>
                .super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl)->m_sceneRoot);
    mat4::inverted((mat4 *)local_70,&local_b4,(bool *)((long)invNodeMatrix.m + 0x3f));
    fVar3 = 0.0;
    fVar4 = 0.0;
    if (invNodeMatrix.m[0xf]._3_1_ == '\x01') {
      fVar4 = (e_00->m_posInSurface).x;
      fVar5 = (e_00->m_posInSurface).y;
      fVar3 = (float)local_70._0_4_ * fVar4 + (float)local_70._4_4_ * fVar5 + invNodeMatrix.m[1];
      fVar4 = invNodeMatrix.m[2] * fVar4 + fVar5 * invNodeMatrix.m[3] + invNodeMatrix.m[5];
    }
    *(ulong *)&(e_00->super_Event).field_0xc = CONCAT44(fVar4,fVar3);
    (*(this->m_pointerEventReceiver->super_SignalEmitter)._vptr_SignalEmitter[3])
              (this->m_pointerEventReceiver,e_00);
  }
  return;
}

Assistant:

inline void StandardSurface::onEvent(Event *e)
{

    switch (e->type()) {
    case Event::PointerDown:
    case Event::PointerUp:
    case Event::PointerMove:
        if (m_renderer && m_renderer->sceneRoot()) {
            PointerEvent *pe = PointerEvent::from(e);
            if (m_pointerEventReceiver) {
                bool inv = false;
                mat4 invNodeMatrix = TransformNode::matrixFor(m_pointerEventReceiver, m_renderer->sceneRoot()).inverted(&inv);
                if (inv)
                    pe->setPosition(invNodeMatrix * pe->positionInSurface());
                else
                    pe->setPosition(vec2());
                m_pointerEventReceiver->onPointerEvent(pe);
            } else {
                deliverPointerEventInScene(m_renderer->sceneRoot(), pe);
            }
        }
        break;
    default:
        std::cerr << __PRETTY_FUNCTION__ << ": unknown event type=" << e->type() << std::endl;
        break;
    }
}